

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assertions.cpp
# Opt level: O3

string * rc::detail::makeWrongExceptionMessage
                   (string *__return_storage_ptr__,string *file,int line,string *assertion,
                   string *expected)

{
  long *plVar1;
  size_type *psVar2;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_48,"Thrown exception did not match ",expected);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_68.field_2._M_allocated_capacity = *psVar2;
    local_68.field_2._8_8_ = plVar1[3];
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar2;
    local_68._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_68._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  makeMessage(__return_storage_ptr__,file,line,assertion,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string makeWrongExceptionMessage(const std::string &file,
                                      int line,
                                      const std::string &assertion,
                                      const std::string &expected) {
  return makeMessage(file,
                     line,
                     assertion,
                     "Thrown exception did not match " + expected + ".");
}